

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68k-dis.c
# Opt level: O0

void floatformat_to_double(floatformat *fmt,void *from,double *to)

{
  undefined1 uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  int norm;
  int sign;
  uint64_t mantissa;
  uint64_t norm_mask;
  float fStack_30;
  bfd_byte tmp;
  int i;
  anon_union_16_4_e75842b7 u;
  double *to_local;
  void *from_local;
  floatformat *fmt_local;
  
  u._8_8_ = to;
  to_local = (double *)from;
  from_local = fmt;
  memcpy(&stack0xffffffffffffffd0,from,(long)fmt->len);
  for (norm_mask._4_4_ = 0; norm_mask._4_4_ < *from_local / 2; norm_mask._4_4_ = norm_mask._4_4_ + 1
      ) {
    uVar1 = *(undefined1 *)((long)&stack0xffffffffffffffd0 + (long)norm_mask._4_4_);
    *(undefined1 *)((long)&stack0xffffffffffffffd0 + (long)norm_mask._4_4_) =
         *(undefined1 *)
          ((long)&stack0xffffffffffffffd0 + (long)((*from_local + -1) - norm_mask._4_4_));
    *(undefined1 *)((long)&stack0xffffffffffffffd0 + (long)((*from_local + -1) - norm_mask._4_4_)) =
         uVar1;
  }
  if (*from_local == 4) {
    *(double *)u._8_8_ = (double)fStack_30;
  }
  else if (*from_local == 8) {
    *(ulong *)u._8_8_ = CONCAT44(i,fStack_30);
  }
  else {
    sign._3_1_ = (undefined1)((uint)i >> 0x18);
    _norm = (undefined7)CONCAT44(i,fStack_30);
    _norm = CONCAT17(sign._3_1_,_norm) & 0x7fffffffffffffff;
    auVar3._8_4_ = (int)(_norm >> 0x20);
    auVar3._0_8_ = _norm;
    auVar3._12_4_ = 0x45300000;
    dVar2 = pow(2.0,(double)(int)(((ushort)u.ext.mantissa_low._2_2_ & 0x7fff) - 0x3fff));
    *(double *)u._8_8_ =
         (double)(int)(((-1 < (short)u.ext.mantissa_low._2_2_) - 1) +
                      (uint)(-1 < (short)u.ext.mantissa_low._2_2_)) *
         ((double)((uint)i >> 0x1f) +
         ((auVar3._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)_norm) - 4503599627370496.0)) / 9.223372036854776e+18) *
         dVar2;
  }
  return;
}

Assistant:

void floatformat_to_double(const struct floatformat* fmt, const void* from, double* to)
{
    // TODO: The code assumes a little endian machine

    union {
        bfd_byte buf[12];
        float f;
        double d;
        struct {
            uint32_t mantissa_low;
            uint32_t mantissa_high; // avoid padding
            uint16_t pad;
            uint16_t exp;
        } ext;
    } u;
    memcpy(u.buf, from, fmt->len);
    for (int i = 0; i < fmt->len / 2; ++i) {
        bfd_byte tmp = u.buf[i];
        u.buf[i] = u.buf[fmt->len - 1 - i];
        u.buf[fmt->len - 1 - i] = tmp;

    }
    if (fmt->len == 4) {
        *to = u.f;
        return;
    } else if (fmt->len == 8) {
        *to = u.d;
        return;
    }
    // Extended precision
    const uint64_t norm_mask = 0x8000000000000000;

    uint64_t mantissa = (uint64_t)u.ext.mantissa_high << 32 | u.ext.mantissa_low;

    const int sign = u.ext.exp & 0x8000 ? -1 : 1;
    const int norm = mantissa & norm_mask ? 1 : 0;
    mantissa &= norm_mask - 1;

    *to = sign * (norm + (double)mantissa  / (double)norm_mask) * pow(2, (u.ext.exp & 0x7fff) - 16383);
}